

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> * __thiscall
pbrt::ParameterDictionary::
lookupArray<pbrt::Point3<float>,pstd::vector<double,pstd::pmr::polymorphic_allocator<double>>const&(*)(pbrt::ParsedParameter_const&),pbrt::Point3<float>(*)(double_const*,pbrt::FileLoc_const*)>
          (vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
           *__return_storage_ptr__,ParameterDictionary *this,string *name,ParameterType type,
          char *typeName,int nPerItem,
          _func_vector<double,_pstd::pmr::polymorphic_allocator<double>_>_ptr_ParsedParameter_ptr
          *getValues,_func_Point3<float>_double_ptr_FileLoc_ptr *convert)

{
  undefined8 uVar1;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar2;
  size_t sVar3;
  ParsedParameter *pPVar4;
  size_t __n;
  ulong uVar5;
  pointer pPVar6;
  int iVar7;
  vector<double,_pstd::pmr::polymorphic_allocator<double>_> *pvVar8;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  undefined1 auVar14 [64];
  undefined4 in_XMM1_Da;
  allocator_type local_59;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *local_58;
  int local_4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  int local_3c;
  char *local_38;
  undefined1 extraout_var [56];
  
  paVar2 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar3 = (this->params).nStored;
  paVar9 = &(this->params).field_2;
  if (paVar2 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar9 = paVar2;
  }
  bVar13 = sVar3 == 0;
  local_58 = __return_storage_ptr__;
  if (!bVar13) {
    lVar11 = 0;
    local_3c = nPerItem;
    local_38 = typeName;
    do {
      pPVar4 = *(ParsedParameter **)((long)paVar9 + lVar11);
      __n = (pPVar4->name)._M_string_length;
      if ((__n == name->_M_string_length) &&
         (((local_48 = &pPVar4->name, __n == 0 ||
           (iVar7 = bcmp((local_48->_M_dataplus)._M_p,(name->_M_dataplus)._M_p,__n), iVar7 == 0)) &&
          (iVar7 = std::__cxx11::string::compare((char *)pPVar4), iVar7 == 0)))) {
        pvVar8 = (*getValues)(pPVar4);
        local_4c = local_3c;
        uVar5 = pvVar8->nStored;
        if (uVar5 == 0) {
          ErrorExit<std::__cxx11::string_const&>
                    (&pPVar4->loc,"No values provided for \"%s\".",local_48);
        }
        uVar10 = (ulong)local_3c;
        if (uVar5 % uVar10 != 0) {
          ErrorExit<std::__cxx11::string_const&,int&>
                    (&pPVar4->loc,"Number of values provided for \"%s\" not a multiple of %d",
                     local_48,&local_4c);
        }
        pPVar4->lookedUp = true;
        std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::vector
                  (local_58,uVar5 / uVar10,&local_59);
        if (uVar10 <= uVar5) {
          lVar11 = 8;
          uVar12 = 0;
          do {
            auVar14._0_8_ = (*convert)(pvVar8->ptr + (long)local_4c * uVar12,&pPVar4->loc);
            auVar14._8_56_ = extraout_var;
            pPVar6 = (local_58->
                     super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>)
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar1 = vmovlps_avx(auVar14._0_16_);
            *(undefined8 *)((long)pPVar6 + lVar11 + -8) = uVar1;
            *(undefined4 *)((long)&(pPVar6->super_Tuple3<pbrt::Point3,_float>).x + lVar11) =
                 in_XMM1_Da;
            uVar12 = uVar12 + 1;
            lVar11 = lVar11 + 0xc;
          } while (uVar12 < uVar5 / uVar10);
        }
        if (!bVar13) {
          return local_58;
        }
        break;
      }
      lVar11 = lVar11 + 8;
      bVar13 = sVar3 << 3 == lVar11;
    } while (!bVar13);
  }
  (local_58->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (local_58->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_58->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return local_58;
}

Assistant:

std::vector<ReturnType> ParameterDictionary::lookupArray(const std::string &name,
                                                         ParameterType type,
                                                         const char *typeName,
                                                         int nPerItem, G getValues,
                                                         C convert) const {
    for (const ParsedParameter *p : params)
        if (p->name == name && p->type == typeName)
            return returnArray<ReturnType>(getValues(*p), *p, nPerItem, convert);

    return {};
}